

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

void b_array::ordered_insert<Map::Pair<int,std::__cxx11::string>>
               (Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *data,size_t *size,
               Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *entry)

{
  Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pPVar1;
  ulong index;
  ulong uVar2;
  
  uVar2 = 0;
  index = 0;
  while (index < *size) {
    pPVar1 = Array<Map::Pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](data,index);
    index = index + 1;
    if (pPVar1->key < entry->key) {
      uVar2 = index & 0xffffffff;
    }
  }
  insert_item<Map::Pair<int,std::__cxx11::string>>(data,(long)(int)uVar2,size,entry);
  return;
}

Assistant:

void ordered_insert(b_array::Array<T>& data, size_t& size, const T& entry) {
    int pos = 0;
    for (size_t i = 0; i < size; i++) {
        if (entry > data[i]) {
            pos = i + 1;
        }
    }
    insert_item(data, pos, size, entry);
}